

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O2

int __thiscall CFunctionTable::Insert(CFunctionTable *this,char *name_cstr,function_fn_t nfunp)

{
  int iVar1;
  uint uVar2;
  size_type sVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)()>_>,_bool>
  pVar4;
  string name;
  allocator<char> local_51;
  function_fn_t local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_50 = nfunp;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name_cstr,&local_51);
  pVar4 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)()>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)()>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)()>>>
          ::_M_emplace_unique<std::__cxx11::string&,void(*&)()>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)()>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)()>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)()>>>
                      *)this,&local_48,&local_50);
  uVar2 = 0;
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    for (sVar3 = 0; local_48._M_string_length != sVar3; sVar3 = sVar3 + 1) {
      iVar1 = toupper((int)local_48._M_dataplus._M_p[sVar3]);
      local_48._M_dataplus._M_p[sVar3] = (char)iVar1;
    }
    pVar4 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)()>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)()>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)()>>>
            ::_M_emplace_unique<std::__cxx11::string&,void(*&)()>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)()>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)()>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)()>>>
                        *)this,&local_48,&local_50);
    uVar2 = (uint)pVar4.second;
  }
  std::__cxx11::string::~string((string *)&local_48);
  return uVar2;
}

Assistant:

int CFunctionTable::Insert(const char* name_cstr, function_fn_t nfunp) {
	std::string name(name_cstr);
	if (!std::get<1>(functions.emplace(name, nfunp))) return 0;
	for (auto& c : name) c = toupper(c);
	return std::get<1>(functions.emplace(name, nfunp));
}